

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# extensions.cc
# Opt level: O1

bool bssl::ssl_setup_extension_permutation(SSL_HANDSHAKE *hs)

{
  ulong uVar1;
  uchar uVar2;
  int iVar3;
  size_t i;
  ulong uVar4;
  ulong uVar5;
  bool bVar6;
  Array<unsigned_char> permutation;
  uint32_t seeds [27];
  uchar *local_98;
  uint local_88 [30];
  
  if ((hs->config->field_0x10e & 4) == 0) {
    return true;
  }
  local_98 = (uchar *)0x0;
  iVar3 = RAND_bytes((uchar *)local_88,0x6c);
  if (iVar3 != 0) {
    OPENSSL_free((void *)0x0);
    local_98 = (uchar *)OPENSSL_malloc(0x1c);
    if (local_98 != (uchar *)0x0) {
      uVar4 = 0;
      do {
        if (0x1b < uVar4) goto LAB_002452e1;
        local_98[uVar4] = (uchar)uVar4;
        uVar4 = uVar4 + 1;
      } while (uVar4 != 0x1c);
      uVar4 = 0x1c;
      do {
        uVar1 = uVar4 - 1;
        if ((0x1b < uVar1) || (uVar5 = (ulong)local_88[uVar4 - 2] % uVar4, 0x1b < uVar5)) {
LAB_002452e1:
          abort();
        }
        uVar2 = local_98[uVar4 - 1];
        local_98[uVar4 - 1] = local_98[uVar5];
        local_98[uVar5] = uVar2;
        uVar4 = uVar1;
      } while (uVar1 != 1);
      OPENSSL_free((hs->extension_permutation).data_);
      (hs->extension_permutation).data_ = (uchar *)0x0;
      (hs->extension_permutation).size_ = 0;
      (hs->extension_permutation).data_ = local_98;
      (hs->extension_permutation).size_ = 0x1c;
      local_98 = (uchar *)0x0;
      bVar6 = true;
      goto LAB_002452cc;
    }
  }
  bVar6 = false;
LAB_002452cc:
  OPENSSL_free(local_98);
  return bVar6;
}

Assistant:

bool ssl_setup_extension_permutation(SSL_HANDSHAKE *hs) {
  if (!hs->config->permute_extensions) {
    return true;
  }

  static_assert(kNumExtensions <= UINT8_MAX,
                "extensions_permutation type is too small");
  uint32_t seeds[kNumExtensions - 1];
  Array<uint8_t> permutation;
  if (!RAND_bytes(reinterpret_cast<uint8_t *>(seeds), sizeof(seeds)) ||
      !permutation.InitForOverwrite(kNumExtensions)) {
    return false;
  }
  for (size_t i = 0; i < kNumExtensions; i++) {
    permutation[i] = i;
  }
  for (size_t i = kNumExtensions - 1; i > 0; i--) {
    // Set element |i| to a randomly-selected element 0 <= j <= i.
    std::swap(permutation[i], permutation[seeds[i - 1] % (i + 1)]);
  }
  hs->extension_permutation = std::move(permutation);
  return true;
}